

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O1

char * Gia_ManRexPreprocess(char *pStr)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  
  sVar2 = strlen(pStr);
  pcVar3 = (char *)calloc(sVar2 * 2 + 10,1);
  pcVar3[0] = '(';
  pcVar3[1] = '(';
  iVar4 = 2;
  do {
    bVar1 = *pStr;
    if (bVar1 - 0x28 < 2) {
      lVar5 = (long)iVar4;
      iVar4 = iVar4 + 1;
      pcVar3[lVar5] = bVar1;
    }
    else if (bVar1 == 0) {
      (pcVar3 + iVar4)[0] = ')';
      (pcVar3 + iVar4)[1] = ')';
      pcVar3[(long)iVar4 + 2] = '\0';
      return pcVar3;
    }
    if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
      lVar5 = (long)iVar4;
      iVar4 = iVar4 + 1;
      pcVar3[lVar5] = bVar1;
    }
    pStr = (char *)((byte *)pStr + 1);
  } while( true );
}

Assistant:

char * Gia_ManRexPreprocess( char * pStr )
{
    char * pCopy = ABC_CALLOC( char, strlen(pStr) * 2 + 10 );
    int i, k = 0;
    pCopy[k++] = '(';
    pCopy[k++] = '(';
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '(' )
            pCopy[k++] = '(';
        else if ( pStr[i] == ')' )
            pCopy[k++] = ')';
        if ( pStr[i] != ' ' && pStr[i] != '\t' && pStr[i] != '\n' && pStr[i] != '\r' )
            pCopy[k++] = pStr[i];
    }
    pCopy[k++] = ')';
    pCopy[k++] = ')';
    pCopy[k++] = '\0';
    return pCopy;
}